

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O3

bool tinyexr::ReadChannelInfo
               (vector<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_> *channels,
               vector<unsigned_char,_std::allocator<unsigned_char>_> *data)

{
  uchar uVar1;
  bool bVar2;
  ulong uVar3;
  undefined8 uVar4;
  ulong uVar5;
  pointer puVar6;
  pointer puVar7;
  ChannelInfo info;
  value_type local_90;
  vector<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_> *local_58;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  puVar7 = (data->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  local_58 = channels;
  if ((data->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
      super__Vector_impl_data._M_finish == puVar7) {
    uVar4 = std::__throw_out_of_range_fmt
                      ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0
                       ,0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90.name._M_dataplus._M_p != &local_90.name.field_2) {
      operator_delete(local_90.name._M_dataplus._M_p);
    }
    _Unwind_Resume(uVar4);
  }
  do {
    local_90.name._M_dataplus._M_p = (pointer)&local_90.name.field_2;
    uVar1 = *puVar7;
    if (uVar1 == '\0') break;
    local_90.name._M_string_length = 0;
    local_90.name.field_2._M_local_buf[0] = '\0';
    puVar6 = (data->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    uVar3 = (long)puVar6 - (long)puVar7;
    if ((long)uVar3 < 0) {
LAB_001caeff:
      bVar2 = false;
    }
    else {
      if (puVar6 == puVar7) {
        puVar7 = (pointer)0x0;
        goto LAB_001caeff;
      }
      uVar5 = 0;
      puVar6 = puVar7;
      do {
        if (*puVar6 == '\0') {
          local_50[0] = local_40;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_50,puVar7,puVar6);
          std::__cxx11::string::operator=((string *)&local_90,(string *)local_50);
          if (local_50[0] != local_40) {
            operator_delete(local_50[0]);
          }
          puVar7 = puVar6 + 0x11;
          if (puVar7 < (data->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                       _M_impl.super__Vector_impl_data._M_finish) {
            local_90.pixel_type = *(int *)(puVar6 + 1);
            local_90.p_linear = puVar6[5];
            local_90.x_sampling = *(int *)(puVar6 + 9);
            local_90.y_sampling = *(int *)(puVar6 + 0xd);
            bVar2 = true;
            std::vector<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>::push_back
                      (local_58,&local_90);
          }
          else {
            puVar7 = puVar6 + 1;
            bVar2 = false;
          }
          goto LAB_001caf02;
        }
        puVar6 = puVar6 + 1;
        uVar5 = uVar5 + 1;
      } while (uVar5 < uVar3);
      puVar7 = (pointer)0x0;
      bVar2 = false;
    }
LAB_001caf02:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90.name._M_dataplus._M_p != &local_90.name.field_2) {
      operator_delete(local_90.name._M_dataplus._M_p);
    }
  } while (bVar2);
  return uVar1 == '\0';
}

Assistant:

static bool ReadChannelInfo(std::vector<ChannelInfo> &channels,
                            const std::vector<unsigned char> &data) {
  const char *p = reinterpret_cast<const char *>(&data.at(0));

  for (;;) {
    if ((*p) == 0) {
      break;
    }
    ChannelInfo info;

    tinyexr_int64 data_len = static_cast<tinyexr_int64>(data.size()) -
                             (p - reinterpret_cast<const char *>(data.data()));
    if (data_len < 0) {
      return false;
    }

    p = ReadString(&info.name, p, size_t(data_len));
    if ((p == NULL) && (info.name.empty())) {
      // Buffer overrun. Issue #51.
      return false;
    }

    const unsigned char *data_end =
        reinterpret_cast<const unsigned char *>(p) + 16;
    if (data_end >= (data.data() + data.size())) {
      return false;
    }

    memcpy(&info.pixel_type, p, sizeof(int));
    p += 4;
    info.p_linear = static_cast<unsigned char>(p[0]);  // uchar
    p += 1 + 3;                                        // reserved: uchar[3]
    memcpy(&info.x_sampling, p, sizeof(int));          // int
    p += 4;
    memcpy(&info.y_sampling, p, sizeof(int));  // int
    p += 4;

    tinyexr::swap4(&info.pixel_type);
    tinyexr::swap4(&info.x_sampling);
    tinyexr::swap4(&info.y_sampling);

    channels.push_back(info);
  }

  return true;
}